

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

void MAFSA_automaton_search_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_letter delim,MAFSA_automaton_string_handler fetcher)

{
  ulong uVar1;
  MAFSA_letter label;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  size_t sVar5;
  uint32_t *puVar6;
  ulong uVar7;
  size_t sVar8;
  MAFSA_stack_struct tmp_stack;
  
  sVar5 = 0;
  do {
    if (sVar5 == sz_l) {
      return;
    }
    puVar6 = ma->ptr_nodes;
    uVar3 = *puVar6;
    tmp_stack.current = -1;
    uVar7 = 0xffffffffffffffff;
    sVar8 = sz_tmp;
    tmp_stack.buffer = tmp;
    tmp_stack.reserved = sz_tmp;
    for (sVar4 = sVar5; (sVar4 & 0xffffffff) <= sz_l; sVar4 = (size_t)((int)sVar4 + 1)) {
      uVar2 = MAFSA_delta(ma->ptr_links,uVar3,delim);
      if (uVar2 != 0) {
        uVar7 = uVar7 + 1;
        if (uVar7 < sVar8) {
          tmp_stack.buffer[uVar7] = delim;
          puVar6 = ma->ptr_nodes;
          tmp_stack.current = uVar7;
        }
        enumerate(ma,puVar6[uVar2],&tmp_stack,fetcher,user_data);
        uVar7 = tmp_stack.current;
        if (-1 < tmp_stack.current) {
          uVar7 = tmp_stack.current - 1;
          tmp_stack.current = uVar7;
        }
      }
      sVar8 = tmp_stack.reserved;
      label = l[sVar4 & 0xffffffff];
      uVar1 = uVar7 + 1;
      if (uVar1 < tmp_stack.reserved) {
        tmp_stack.buffer[uVar1] = label;
        uVar7 = uVar1;
        tmp_stack.current = uVar1;
      }
      uVar3 = MAFSA_delta(ma->ptr_links,uVar3,label);
      if (uVar3 == 0) break;
      puVar6 = ma->ptr_nodes;
      uVar3 = puVar6[uVar3];
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

extern void MAFSA_automaton_search_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_letter delim, MAFSA_automaton_string_handler fetcher)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; ++cur_pos)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        struct MAFSA_stack_struct tmp_stack;

        tmp_stack.buffer   = tmp;
        tmp_stack.reserved = sz_tmp;
        tmp_stack.current  = -1;

        while (i <= sz_l)
        {
            MAFSA_letter label;

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
            {
                stack_push(&tmp_stack, delim);
                enumerate(ma, ma->ptr_nodes[where], &tmp_stack, fetcher, user_data);
                stack_pop(&tmp_stack);
            }

            label = l[i++];
            stack_push(&tmp_stack, label);

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }
    }
}